

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void Test23(void)

{
  CMReturn In;
  CMReturn In_00;
  allocator<char> local_21a9;
  CMReturn res;
  CMReturn local_2158;
  undefined1 local_2140;
  undefined7 uStack_213f;
  undefined1 uStack_2138;
  undefined7 uStack_2137;
  undefined1 uStack_2130;
  undefined7 uStack_212f;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2110;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  string in;
  string local_20c0;
  string local_20a0;
  string local_2080;
  string local_2060;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2040;
  ConfusableMatcher matcher;
  
  GetDefaultMap_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,"AA BB CC AA FF AA RR",(allocator<char> *)&matcher);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2110,&map);
  local_2040._M_buckets = &local_2040._M_single_bucket;
  local_2040._M_bucket_count = 1;
  local_2040._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_2040._M_element_count = 0;
  local_2040._M_rehash_policy._M_max_load_factor = 1.0;
  local_2040._M_rehash_policy._4_4_ = 0;
  local_2040._M_rehash_policy._M_next_resize = 0;
  local_2040._M_single_bucket = (__node_base_ptr)0x0;
  ConfusableMatcher::ConfusableMatcher
            (&matcher,&local_2110,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2040,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2040);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2110);
  std::__cxx11::string::string((string *)&local_2060,(string *)&in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2080,"AA",(allocator<char> *)&local_2158);
  local_2140 = 1;
  uStack_213f = 0;
  uStack_2138 = 0;
  uStack_2137 = 0;
  uStack_2130 = 0;
  uStack_212f = 0;
  uStack_2128 = 1000000;
  local_2120 = 0;
  uStack_2118 = 0;
  ConfusableMatcher::IndexOf
            (&res,&matcher,&local_2060,&local_2080,
             (CMOptions)ZEXT3248(CONCAT824(1000000,CONCAT816(0,ZEXT816(1)))));
  std::__cxx11::string::~string((string *)&local_2080);
  std::__cxx11::string::~string((string *)&local_2060);
  In.Size = res.Size;
  In.Start = res.Start;
  In.Status = res.Status;
  In._20_4_ = res._20_4_;
  AssertMatch(In,0,2);
  std::__cxx11::string::string((string *)&local_20a0,(string *)&in);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20c0,"AA",&local_21a9);
  ConfusableMatcher::IndexOf
            (&local_2158,&matcher,&local_20a0,&local_20c0,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,CONCAT420(0,CONCAT416(1,CONCAT88(in._M_string_length - 1,1))
                                                 ))));
  res.Status = local_2158.Status;
  res._20_4_ = local_2158._20_4_;
  res.Start = local_2158.Start;
  res.Size = local_2158.Size;
  std::__cxx11::string::~string((string *)&local_20c0);
  std::__cxx11::string::~string((string *)&local_20a0);
  In_00.Size = res.Size;
  In_00.Start = res.Start;
  In_00.Status = res.Status;
  In_00._20_4_ = res._20_4_;
  AssertMatch(In_00,0xf,2);
  ConfusableMatcher::~ConfusableMatcher(&matcher);
  std::__cxx11::string::~string((string *)&in);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&map);
  return;
}

Assistant:

void Test23()
{
	auto map = GetDefaultMap();

	std::string in = "AA BB CC AA FF AA RR";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, {});
	auto res = matcher.IndexOf(in, "AA", opts);
	AssertMatch(res, 0, 2);

	opts.StartIndex = in.size() - 1;
	opts.StartFromEnd = true;
	res = matcher.IndexOf(in, "AA", opts);
	AssertMatch(res, 15, 2);
}